

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::GetAttachmentParametersTest::CreateRenderbufferFramebuffer
          (GetAttachmentParametersTest *this,bool depth,bool stencil)

{
  int iVar1;
  deUint32 dVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  undefined4 *puVar5;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfdf);
  (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfe2);
  (**(code **)(lVar4 + 0x6e8))(3,this->m_rbo);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfe5);
  (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rbo[0]);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfe8);
  (**(code **)(lVar4 + 0x1238))(0x8d41,0x8058,1,2);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfeb);
  (**(code **)(lVar4 + 0x688))(0x8d40,0x8ce0,0x8d41,this->m_rbo[0]);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xfee);
  if (depth && !stencil) {
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xff3);
    (**(code **)(lVar4 + 0x1238))(0x8d41,0x81a6,1,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xff6);
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8d00,0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xff9);
  }
  if (!depth && stencil) {
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0xfff);
    (**(code **)(lVar4 + 0x1238))(0x8d41,0x8d48,1,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1002);
    (**(code **)(lVar4 + 0x688))(0x8d40,0x8d20,0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1005);
  }
  if (depth && stencil) {
    (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glBindRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x100b);
    (**(code **)(lVar4 + 0x1238))(0x8d41,0x88f0,1,2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glRenderbufferStorage has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x100e);
    (**(code **)(lVar4 + 0x688))(0x8d40,0x821a,0x8d41,this->m_rbo[1]);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"glFramebufferRenderbuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x1011);
  }
  GVar3 = glwCheckFramebufferStatus(0x8d40);
  if (GVar3 == 0x8cd5) {
    return;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b0 + 8),"Unexpectedly framebuffer was incomplete.",0x28);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void GetAttachmentParametersTest::CreateRenderbufferFramebuffer(bool depth, bool stencil)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

	gl.genRenderbuffers(3, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

	gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, 1, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_rbo[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");

	if (depth && (!stencil))
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	if ((!depth) && stencil)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	if (depth && stencil)
	{
		gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffers has failed");

		gl.renderbufferStorage(GL_RENDERBUFFER, GL_DEPTH24_STENCIL8, 1, 2);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, m_rbo[1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
	}

	/* Check that framebuffer is complete. */
	if (GL_FRAMEBUFFER_COMPLETE != glCheckFramebufferStatus(GL_FRAMEBUFFER))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Unexpectedly framebuffer was incomplete."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}